

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_getinfo(lua_State *L)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *what;
  lua_Integer lVar6;
  TValue *pTVar7;
  char *v;
  int idx;
  char *i;
  lua_State *L_00;
  uint uVar8;
  lj_Debug ar;
  
  pTVar7 = L->base;
  uVar8 = 0;
  L_00 = L;
  if ((pTVar7 < L->top) && ((pTVar7->field_2).it == 0xfffffff9)) {
    uVar8 = 1;
    L_00 = (lua_State *)(ulong)(pTVar7->u32).lo;
  }
  what = luaL_optlstring(L,uVar8 + 2,"flnSu",(size_t *)0x0);
  idx = uVar8 + 1;
  iVar5 = lua_isnumber(L,idx);
  if (iVar5 == 0) {
    pTVar7 = (TValue *)((ulong)(uVar8 * 8) + (long)L->base);
    if ((L->top <= pTVar7) || ((pTVar7->field_2).it != 0xfffffff7)) {
      lj_err_arg(L,idx,LJ_ERR_NOFUNCL);
    }
    what = lua_pushfstring(L,">%s",what);
    pTVar7 = L_00->top;
    L_00->top = pTVar7 + 1;
    (pTVar7->field_2).field_0 = L->base[uVar8].field_2.field_0;
    (pTVar7->field_2).it = 0xfffffff7;
  }
  else {
    lVar6 = lua_tointeger(L,idx);
    iVar5 = lua_getstack(L_00,(int)lVar6,(lua_Debug *)&ar);
    if (iVar5 == 0) {
      *(undefined4 *)((long)L->top + -4) = 0xffffffff;
      return 1;
    }
  }
  iVar5 = lj_debug_getinfo(L_00,what,&ar,1);
  if (iVar5 == 0) {
    lj_err_arg(L,uVar8 + 2,LJ_ERR_INVOPT);
  }
  bVar3 = false;
  lua_createtable(L,0,0x10);
  bVar2 = false;
  do {
    cVar1 = *what;
    if (cVar1 == 'L') {
      bVar2 = true;
      bVar4 = bVar3;
    }
    else if (cVar1 == 'S') {
      settabss(L,"source",ar.source);
      settabss(L,"short_src",ar.short_src);
      settabsi(L,"linedefined",ar.linedefined);
      settabsi(L,"lastlinedefined",ar.lastlinedefined);
      i = "what";
      v = ar.what;
LAB_00121515:
      settabss(L,i,v);
      bVar4 = bVar3;
    }
    else {
      bVar4 = true;
      if (cVar1 != 'f') {
        if (cVar1 == 'l') {
          settabsi(L,"currentline",ar.currentline);
          bVar4 = bVar3;
        }
        else {
          if (cVar1 == 'n') {
            settabss(L,"name",ar.name);
            i = "namewhat";
            v = ar.namewhat;
            goto LAB_00121515;
          }
          if (cVar1 == 'u') {
            settabsi(L,"nups",ar.nups);
            settabsi(L,"nparams",ar.nparams);
            lua_pushboolean(L,ar.isvararg);
            lua_setfield(L,-2,"isvararg");
            bVar4 = bVar3;
          }
          else {
            bVar4 = bVar3;
            if (cVar1 == '\0') {
              if (bVar2) {
                treatstackoption(L,L_00,"activelines");
              }
              if (bVar3) {
                treatstackoption(L,L_00,"func");
              }
              return 1;
            }
          }
        }
      }
    }
    bVar3 = bVar4;
    what = what + 1;
  } while( true );
}

Assistant:

LJLIB_CF(debug_getinfo)
{
  lj_Debug ar;
  int arg, opt_f = 0, opt_L = 0;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSu");
  if (lua_isnumber(L, arg+1)) {
    if (!lua_getstack(L1, (int)lua_tointeger(L, arg+1), (lua_Debug *)&ar)) {
      setnilV(L->top-1);
      return 1;
    }
  } else if (L->base+arg < L->top && tvisfunc(L->base+arg)) {
    options = lua_pushfstring(L, ">%s", options);
    setfuncV(L1, L1->top++, funcV(L->base+arg));
  } else {
    lj_err_arg(L, arg+1, LJ_ERR_NOFUNCL);
  }
  if (!lj_debug_getinfo(L1, options, &ar, 1))
    lj_err_arg(L, arg+2, LJ_ERR_INVOPT);
  lua_createtable(L, 0, 16);  /* Create result table. */
  for (; *options; options++) {
    switch (*options) {
    case 'S':
      settabss(L, "source", ar.source);
      settabss(L, "short_src", ar.short_src);
      settabsi(L, "linedefined", ar.linedefined);
      settabsi(L, "lastlinedefined", ar.lastlinedefined);
      settabss(L, "what", ar.what);
      break;
    case 'l':
      settabsi(L, "currentline", ar.currentline);
      break;
    case 'u':
      settabsi(L, "nups", ar.nups);
      settabsi(L, "nparams", ar.nparams);
      settabsb(L, "isvararg", ar.isvararg);
      break;
    case 'n':
      settabss(L, "name", ar.name);
      settabss(L, "namewhat", ar.namewhat);
      break;
    case 'f': opt_f = 1; break;
    case 'L': opt_L = 1; break;
    default: break;
    }
  }
  if (opt_L) treatstackoption(L, L1, "activelines");
  if (opt_f) treatstackoption(L, L1, "func");
  return 1;  /* Return result table. */
}